

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O1

LispPTR N_OP_assoc(LispPTR key,LispPTR list)

{
  LispPTR LVar1;
  cadr_cell cVar2;
  LispPTR cell_adr;
  ulong uVar3;
  
  if ((list != 0) &&
     ((*(ushort *)((ulong)(list >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)) {
    cVar2 = cadr(list);
    uVar3 = (ulong)cVar2 >> 0x20;
    do {
      if (((*(ushort *)((ulong)(cVar2._1_4_ & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) &&
         (LVar1 = car(cVar2.car_cell), LVar1 == key)) {
        return cVar2.car_cell;
      }
      cell_adr = (LispPTR)uVar3;
      LVar1 = 0;
      if ((*(ushort *)((ulong)((uint)(uVar3 >> 8) & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)
      {
        cVar2 = cadr(cell_adr);
        uVar3 = (ulong)cVar2 >> 0x20;
        LVar1 = cell_adr;
      }
      if (MachineState.irqend == 0) {
        MachineState.tosvalue = LVar1;
        MachineState.errorexit = 1;
        return 0xfffffffe;
      }
    } while (LVar1 != 0);
  }
  return 0;
}

Assistant:

LispPTR N_OP_assoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdr; /* address of (cdr A-list); Lisp address */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (!Listp(list)) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdr = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdr))
      cadr1 = cadr(cdr);
    else
      cdr = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdr; /* for next execution */
      TIMER_EXIT(cdr);
    }
  } while (cdr != NIL_PTR);

  return (NIL_PTR);
}